

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

Gia_Man_t *
Gia_ManCorrSpecReduceInit
          (Gia_Man_t *p,int nFrames,int nPrefix,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int *piVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint local_5c;
  
  if (nFrames < 2 || fScorr != 0) {
    if ((nPrefix == 0) && (nFrames < 1 || fScorr == 0)) {
      __assert_fail("(!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0xe5,
                    "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                   );
    }
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0xe6,
                  "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0xe7,
                  "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                 );
  }
  iVar6 = nPrefix + nFrames;
  iVar14 = fScorr + iVar6;
  uVar16 = (long)iVar14 * (long)p->nObjs;
  iVar19 = (int)uVar16;
  if ((p->vCopies).nCap < iVar19) {
    piVar7 = (p->vCopies).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(uVar16 * 4);
    }
    else {
      piVar7 = (int *)realloc(piVar7,uVar16 * 4);
    }
    (p->vCopies).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = iVar19;
  }
  if (0 < iVar19) {
    memset((p->vCopies).pArray,0xff,(uVar16 & 0xffffffff) << 2);
  }
  (p->vCopies).nSize = iVar19;
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs * iVar6);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  Gia_ManHashAlloc(p_00);
  iVar19 = p->nRegs;
  if (0 < iVar19) {
    iVar17 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar15 = (iVar1 - iVar19) + iVar17;
      if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) {
LAB_005ceb85:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar19 = p->vCis->pArray[uVar15];
      if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) {
LAB_005ceb47:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_005ceb28;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      if ((pGVar10 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar10)) goto LAB_005ceb28;
      pGVar3 = pGVar3 + iVar19;
      pGVar4 = p->pObjs;
      if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_005ceb28;
      uVar15 = (int)((long)pGVar3 - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar15 < 0) || ((p->vCopies).nSize <= (int)uVar15)) goto LAB_005ceb66;
      (p->vCopies).pArray[uVar15 & 0x7fffffff] = 0;
      iVar17 = iVar17 + 1;
      iVar19 = p->nRegs;
      if (iVar19 <= iVar17) break;
    } while( true );
  }
  if (0 < iVar14) {
    iVar19 = 0;
    do {
      if (p->nObjs < 1) {
LAB_005ceb28:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar15 = p->nObjs * iVar19;
      if (((int)uVar15 < 0) || ((p->vCopies).nSize <= (int)uVar15)) {
LAB_005ceb66:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[uVar15] = 0;
      pVVar11 = p->vCis;
      uVar16 = (ulong)(uint)pVVar11->nSize;
      if (p->nRegs < pVVar11->nSize) {
        lVar18 = 0;
        do {
          if ((int)uVar16 <= lVar18) goto LAB_005ceb85;
          iVar17 = pVVar11->pArray[lVar18];
          if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_005ceb47;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar16 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar16 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar16 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_005ceb28;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_005ceb28;
          pGVar3 = pGVar3 + iVar17;
          pGVar5 = p->pObjs;
          if ((pGVar3 < pGVar5) || (pGVar5 + p->nObjs <= pGVar3)) goto LAB_005ceb28;
          uVar15 = (int)((ulong)((long)pGVar3 - (long)pGVar5) >> 2) * -0x55555555 +
                   p->nObjs * iVar19;
          if (((int)uVar15 < 0) || ((p->vCopies).nSize <= (int)uVar15)) goto LAB_005ceb66;
          (p->vCopies).pArray[uVar15] =
               (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
          lVar18 = lVar18 + 1;
          pVVar11 = p->vCis;
          uVar16 = (ulong)pVVar11->nSize;
        } while (lVar18 < (long)(uVar16 - (long)p->nRegs));
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar14);
  }
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar11->pArray = piVar7;
  *pvOutputs = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar11->pArray = piVar7;
  if (nFrames < 1) {
LAB_005ceaac:
    if (piVar7 == (int *)0x0) goto LAB_005ceab9;
  }
  else {
    uVar16 = (ulong)(uint)p->nObjs;
    iVar14 = nPrefix;
    do {
      if (1 < (int)uVar16) {
        lVar18 = 1;
        lVar20 = 0xc;
        do {
          uVar13 = (ulong)(uint)p->pReprs[lVar18] & 0xfffffff;
          if (uVar13 != 0xfffffff) {
            if ((uint)uVar16 <= (uint)uVar13) goto LAB_005ceb47;
            pGVar3 = p->pObjs;
            if (pGVar3 != (Gia_Obj_t *)0x0) {
              pGVar4 = pGVar3 + uVar13;
              if ((uint)uVar13 == 0) {
                local_5c = 0;
              }
              else {
                local_5c = Gia_ManCorrSpecReal(p_00,p,pGVar4,iVar14,nPrefix);
              }
              pGVar10 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar20);
              uVar15 = Gia_ManCorrSpecReal(p_00,p,pGVar10,iVar14,nPrefix);
              if ((int)uVar15 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf5,"int Abc_LitNotCond(int, int)");
              }
              uVar15 = uVar15 ^ ((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) ^
                                (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20)) >> 0x1f;
              if (local_5c != uVar15) {
                pGVar5 = p->pObjs;
                if ((pGVar4 < pGVar5) || (pGVar5 + p->nObjs <= pGVar4)) goto LAB_005ceb28;
                Vec_IntPush(*pvOutputs,
                            (int)((ulong)((long)pGVar4 - (long)pGVar5) >> 2) * -0x55555555);
                pGVar4 = p->pObjs;
                if ((pGVar10 < pGVar4) || (pGVar4 + p->nObjs <= pGVar10)) goto LAB_005ceb28;
                Vec_IntPush(*pvOutputs,
                            (int)((ulong)((long)pGVar3 + (lVar20 - (long)pGVar4)) >> 2) *
                            -0x55555555);
                iVar19 = Gia_ManHashXor(p_00,local_5c,uVar15);
                Vec_IntPush(pVVar11,iVar19);
              }
            }
          }
          lVar18 = lVar18 + 1;
          uVar16 = (ulong)p->nObjs;
          lVar20 = lVar20 + 0xc;
        } while (lVar18 < (long)uVar16);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < iVar6);
    iVar6 = pVVar11->nSize;
    piVar7 = pVVar11->pArray;
    if ((long)iVar6 < 1) goto LAB_005ceaac;
    lVar18 = 0;
    do {
      Gia_ManAppendCo(p_00,piVar7[lVar18]);
      lVar18 = lVar18 + 1;
    } while (iVar6 != lVar18);
  }
  free(piVar7);
LAB_005ceab9:
  free(pVVar11);
  Gia_ManHashStop(p_00);
  piVar7 = (p->vCopies).pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    (p->vCopies).pArray = (int *)0x0;
  }
  (p->vCopies).nCap = 0;
  (p->vCopies).nSize = 0;
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduceInit( Gia_Man_t * p, int nFrames, int nPrefix, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrevNew, iObjNew;
    assert( (!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+nPrefix+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( (nFrames+nPrefix) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_ManAppendCi(pNew);
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    }
    for ( f = 0; f < nFrames+nPrefix+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    for ( f = nPrefix; f < nFrames+nPrefix; f++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, f, nPrefix );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, f, nPrefix );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}